

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tagger.cpp
# Opt level: O1

char * __thiscall MeCab::anon_unknown_0::LatticeImpl::toString(LatticeImpl *this,Node *node)

{
  StringBuffer *pSVar1;
  char *pcVar2;
  
  if ((this->ostrs_).ptr_ == (StringBuffer *)0x0) {
    pSVar1 = (StringBuffer *)operator_new(0x28);
    pSVar1->_vptr_StringBuffer = (_func_int **)&PTR__StringBuffer_00173118;
    pSVar1->size_ = 0;
    pSVar1->alloc_size_ = 0;
    pSVar1->ptr_ = (char *)0x0;
    pSVar1->is_delete_ = true;
    pSVar1->error_ = false;
    (this->ostrs_).ptr_ = pSVar1;
  }
  pcVar2 = toStringInternal(this,node,(this->ostrs_).ptr_);
  return pcVar2;
}

Assistant:

const char *LatticeImpl::toString(const Node *node) {
  return toStringInternal(node, stream());
}